

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walksymbol.c
# Opt level: O0

void walk_statement(dmr_C *C,statement *stmt,symbol_visitor *visitor)

{
  _func_void_void_ptr_char_ptr *p_Var1;
  void *pvVar2;
  char *pcVar3;
  expression *cond;
  ptr_list_iter siter__;
  statement *s;
  symbol_visitor *visitor_local;
  statement *stmt_local;
  dmr_C *C_local;
  
  if (stmt != (statement *)0x0) {
    (*visitor->begin_statement)(visitor->data,stmt->type);
    switch(stmt->type) {
    case STMT_NONE:
      break;
    case STMT_DECLARATION:
      dmrC_walk_symbol_list(C,(symbol_list *)(stmt->field_2).field_1.expression,visitor);
      break;
    case STMT_EXPRESSION:
      walk_expression(C,(stmt->field_2).field_1.expression,visitor);
      break;
    case STMT_COMPOUND:
      ptrlist_forward_iterator
                ((ptr_list_iter *)&cond,(ptr_list *)(stmt->field_2).field_1.expression);
      siter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&cond);
      while (siter__._16_8_ != 0) {
        walk_statement(C,(statement *)siter__._16_8_,visitor);
        siter__._16_8_ = ptrlist_iter_next((ptr_list_iter *)&cond);
      }
      if ((stmt->field_2).field_1.context != (expression *)0x0) {
        walk_label(C,(stmt->field_2).field_2.ret_target,visitor);
      }
      break;
    case STMT_IF:
      walk_expression(C,(stmt->field_2).field_1.expression,visitor);
      (*visitor->begin_if_then)(visitor->data);
      walk_statement(C,(stmt->field_2).field_3.if_true,visitor);
      (*visitor->end_if_then)(visitor->data);
      if ((stmt->field_2).field_3.if_false != (statement *)0x0) {
        (*visitor->begin_if_else)(visitor->data);
        walk_statement(C,(stmt->field_2).field_3.if_false,visitor);
        (*visitor->end_if_else)(visitor->data);
      }
      break;
    case STMT_RETURN:
      walk_return_statement(C,stmt,visitor);
      break;
    case STMT_CASE:
      walk_label(C,(stmt->field_2).field_6.case_label,visitor);
      walk_statement(C,(stmt->field_2).field_3.if_false,visitor);
      break;
    case STMT_SWITCH:
      walk_switch_statement(C,stmt,visitor);
      break;
    case STMT_ITERATOR:
      walk_iterator_statement(C,stmt,visitor);
      break;
    case STMT_LABEL:
      p_Var1 = visitor->begin_label;
      pvVar2 = visitor->data;
      pcVar3 = dmrC_show_ident(C,((stmt->field_2).field_5.label_identifier)->ident);
      (*p_Var1)(pvVar2,pcVar3);
      dmrC_walk_symbol(C,(stmt->field_2).field_5.label_identifier,visitor);
      (*visitor->end_label)(visitor->data);
      walk_statement(C,(stmt->field_2).field_3.if_true,visitor);
      break;
    case STMT_GOTO:
      if ((stmt->field_2).field_1.context == (expression *)0x0) {
        dmrC_walk_symbol(C,(stmt->field_2).field_5.label_identifier,visitor);
      }
      else {
        walk_expression(C,(stmt->field_2).field_1.context,visitor);
      }
      break;
    case STMT_ASM:
      break;
    case STMT_CONTEXT:
      break;
    case STMT_RANGE:
    }
    (*visitor->end_statement)(visitor->data);
  }
  return;
}

Assistant:

void walk_statement(struct dmr_C *C, struct statement *stmt, struct symbol_visitor *visitor)
{
	if (!stmt)
		return;

	visitor->begin_statement(visitor->data, stmt->type);
	switch (stmt->type) {
	case STMT_DECLARATION:
		dmrC_walk_symbol_list(C, stmt->declaration, visitor);
		break;
	case STMT_RETURN:
		walk_return_statement(C, stmt, visitor);
		break;
	case STMT_COMPOUND: {
		struct statement *s;
		// if (stmt->inline_fn) {
		//	dmrC_show_statement(C, stmt->args);
		//	printf("\tbegin_inline \t%s\n", dmrC_show_ident(C,
		// stmt->inline_fn->ident));
		//}
		FOR_EACH_PTR(stmt->stmts, s) { walk_statement(C, s, visitor); }
		END_FOR_EACH_PTR(s);
		if (stmt->ret) {
			walk_label(C, stmt->ret, visitor);
		}
		// if (stmt->inline_fn)
		//	printf("\tend_inlined\t%s\n", dmrC_show_ident(C,
		// stmt->inline_fn->ident));
		break;
	}

	case STMT_EXPRESSION:
		walk_expression(C, stmt->expression, visitor);
		break;
	case STMT_IF: {
		struct expression *cond = stmt->if_conditional;
		walk_expression(C, cond, visitor);
		visitor->begin_if_then(visitor->data);
		walk_statement(C, stmt->if_true, visitor);
		visitor->end_if_then(visitor->data);
		if (stmt->if_false) {
			visitor->begin_if_else(visitor->data);
			walk_statement(C, stmt->if_false, visitor);
			visitor->end_if_else(visitor->data);
		}
		break;
	}
	case STMT_SWITCH:
		walk_switch_statement(C, stmt, visitor);
		break;

	case STMT_CASE:
		walk_label(C, stmt->case_label, visitor);
		walk_statement(C, stmt->case_statement, visitor);
		break;

	case STMT_ITERATOR:
		walk_iterator_statement(C, stmt, visitor);
		break;

	case STMT_NONE:
		break;

	case STMT_LABEL:
		visitor->begin_label(visitor->data, dmrC_show_ident(C, stmt->label_identifier->ident));
		dmrC_walk_symbol(C, stmt->label_identifier, visitor);
		visitor->end_label(visitor->data);
		walk_statement(C, stmt->label_statement, visitor);
		break;

	case STMT_GOTO:
		if (stmt->goto_expression) {
			walk_expression(C, stmt->goto_expression, visitor);
		} else {
			dmrC_walk_symbol(C, stmt->goto_label, visitor);
		}
		break;
	case STMT_ASM:
		// printf("\tasm( .... )\n");
		break;
	case STMT_CONTEXT: {
		// int val = dmrC_show_expression(C, stmt->expression);
		// printf("\tcontext( %d )\n", val);
		break;
	}
	case STMT_RANGE: {
		// int val = dmrC_show_expression(C, stmt->range_expression);
		// int low = dmrC_show_expression(C, stmt->range_low);
		// int high = dmrC_show_expression(C, stmt->range_high);
		// printf("\trange( %d %d-%d)\n", val, low, high);
		break;
	}
	}
	visitor->end_statement(visitor->data);
}